

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

void __thiscall OpenMD::SimInfo::calcNdf(SimInfo *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int nfq_local;
  int local_30;
  int local_2c;
  
  p_Var6 = (_Base_ptr)0x0;
  local_30 = 0;
  local_2c = 0;
  p_Var5 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 == p_Var1) goto LAB_0013cedb;
  do {
    p_Var6 = p_Var5[1]._M_parent;
LAB_0013cedb:
    while( true ) {
      if (p_Var6 == (_Base_ptr)0x0) {
        this->ndfLocal_ = local_30;
        local_30 = local_30 - this->nConstraints_;
        MPI_Allreduce(&local_30,&this->ndf_,1,&ompi_mpi_int,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
        MPI_Allreduce(&local_2c,&this->nGlobalFluctuatingCharges_,1,&ompi_mpi_int,&ompi_mpi_op_sum,
                      &ompi_mpi_comm_world);
        this->ndf_ = (this->ndf_ - this->nZconstraint_) + -3;
        return;
      }
      p_Var3 = *(_Base_ptr *)(p_Var6 + 5);
      if (p_Var3 == p_Var6[5]._M_parent) {
        p_Var4 = (_Base_ptr)0x0;
      }
      else {
        p_Var4 = *(_Base_ptr *)p_Var3;
      }
      while (p_Var4 != (_Base_ptr)0x0) {
        p_Var3 = (_Base_ptr)&p_Var3->_M_parent;
        if (*(int *)&p_Var4->_M_parent - 1U < 2) {
          if ((char)p_Var4[1]._M_color == _S_black) {
            local_30 = local_30 + 5;
          }
          else {
            local_30 = local_30 + 6;
          }
        }
        else {
          local_30 = local_30 + 3;
        }
        if (p_Var3 == p_Var6[5]._M_parent) {
          p_Var4 = (_Base_ptr)0x0;
        }
        else {
          p_Var4 = *(_Base_ptr *)p_Var3;
        }
      }
      p_Var3 = *(_Base_ptr *)(p_Var6 + 8);
      if (p_Var3 == p_Var6[8]._M_parent) {
        p_Var4 = (_Base_ptr)0x0;
      }
      else {
        p_Var4 = *(_Base_ptr *)p_Var3;
      }
      while (p_Var4 != (_Base_ptr)0x0) {
        p_Var3 = (_Base_ptr)&p_Var3->_M_parent;
        bVar2 = AtomType::isFluctuatingCharge((AtomType *)p_Var4[3]._M_right);
        if (bVar2) {
          local_2c = local_2c + 1;
        }
        if (p_Var3 == p_Var6[8]._M_parent) {
          p_Var4 = (_Base_ptr)0x0;
        }
        else {
          p_Var4 = *(_Base_ptr *)p_Var3;
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      if ((_Rb_tree_header *)p_Var5 != p_Var1) break;
      p_Var6 = (_Base_ptr)0x0;
    }
  } while( true );
}

Assistant:

void SimInfo::calcNdf() {
    int ndf_local, nfq_local;
    MoleculeIterator i;
    vector<StuntDouble*>::iterator j;
    vector<Atom*>::iterator k;

    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;

    ndf_local = 0;
    nfq_local = 0;

    for (mol = beginMolecule(i); mol != NULL; mol = nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndf_local += 3;

        if (sd->isDirectional()) {
          if (sd->isLinear()) {
            ndf_local += 2;
          } else {
            ndf_local += 3;
          }
        }
      }

      for (atom = mol->beginFluctuatingCharge(k); atom != NULL;
           atom = mol->nextFluctuatingCharge(k)) {
        if (atom->isFluctuatingCharge()) { nfq_local++; }
      }
    }

    ndfLocal_ = ndf_local;

    // n_constraints is local, so subtract them on each processor
    ndf_local -= nConstraints_;

#ifdef IS_MPI
    MPI_Allreduce(&ndf_local, &ndf_, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(&nfq_local, &nGlobalFluctuatingCharges_, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    ndf_                       = ndf_local;
    nGlobalFluctuatingCharges_ = nfq_local;
#endif

    // nZconstraints_ is global, as are the 3 COM translations for the
    // entire system:
    ndf_ = ndf_ - 3 - nZconstraint_;
  }